

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O1

pool_ptr<soul::Module> __thiscall
soul::Program::ProgramImpl::findModuleContainingFunction(ProgramImpl *this,Function *f)

{
  long *plVar1;
  pool_ref<soul::heart::Function> *ppVar2;
  long lVar3;
  long *plVar4;
  bool bVar5;
  
  plVar4 = (long *)(f->parameters).numActive;
  plVar1 = (long *)(f->parameters).numAllocated;
  bVar5 = plVar4 == plVar1;
  if (!bVar5) {
    lVar3 = *plVar4;
    ppVar2 = std::
             __find_if<soul::pool_ref<soul::heart::Function>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Function_const>>
                       (*(long *)(lVar3 + 0x130),
                        *(long *)(lVar3 + 0x130) + *(long *)(lVar3 + 0x138) * 8);
    if (ppVar2 == (pool_ref<soul::heart::Function> *)
                  (*(long *)(lVar3 + 0x138) * 8 + *(long *)(lVar3 + 0x130))) {
      do {
        plVar4 = plVar4 + 1;
        bVar5 = plVar4 == plVar1;
        if (bVar5) goto LAB_001e56ff;
        lVar3 = *plVar4;
        ppVar2 = std::
                 __find_if<soul::pool_ref<soul::heart::Function>const*,__gnu_cxx::__ops::_Iter_equals_val<soul::heart::Function_const>>
                           (*(long *)(lVar3 + 0x130),
                            *(long *)(lVar3 + 0x130) + *(long *)(lVar3 + 0x138) * 8);
      } while (ppVar2 == (pool_ref<soul::heart::Function> *)
                         (*(long *)(lVar3 + 0x138) * 8 + *(long *)(lVar3 + 0x130)));
    }
    if (!bVar5) {
      lVar3 = *plVar4;
      goto LAB_001e5706;
    }
  }
LAB_001e56ff:
  lVar3 = 0;
LAB_001e5706:
  *(long *)this = lVar3;
  return (pool_ptr<soul::Module>)(Module *)this;
}

Assistant:

pool_ptr<Module> findModuleContainingFunction (const heart::Function& f) const
    {
        for (auto& m : modules)
            if (m->functions.contains (f))
                return m;

        return {};
    }